

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_rotate(lua_State *L,int idx,int n)

{
  lua_State *L_00;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  StkId from;
  StkId from_00;
  
  from = L->top + -1;
  L_00 = (lua_State *)index2addr(L,idx);
  if (n < 0) {
    from_00 = (StkId)((long)L_00 + (long)n * -0x10 + -0x10);
  }
  else {
    from_00 = from + -(ulong)(uint)n;
  }
  reverse(L_00,from_00,(StkId)CONCAT44(extraout_var,extraout_EDX));
  reverse((lua_State *)(from_00 + 1),from,(StkId)CONCAT44(extraout_var_00,extraout_EDX_00));
  reverse(L_00,from,(StkId)CONCAT44(extraout_var_01,extraout_EDX_01));
  return;
}

Assistant:

LUA_API void lua_rotate(lua_State *L, int idx, int n) {
    StkId p, t, m;
    lua_lock(L);
    t = L->top - 1;  /* end of stack segment being rotated */
    p = index2addr(L, idx);  /* start of segment */
    api_checkstackindex(L, idx, p);
    api_check(L, (n >= 0 ? n : -n) <= (t - p + 1), "invalid 'n'");
    m = (n >= 0 ? t - n : p - n - 1);  /* end of prefix */
    reverse(L, p, m);  /* reverse the prefix with length 'n' */
    reverse(L, m + 1, t);  /* reverse the suffix */
    reverse(L, p, t);  /* reverse the entire segment */
    lua_unlock(L);
}